

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

Matrix44 * __thiscall jpgd::DCT_Upsample::Matrix44::operator-=(Matrix44 *this,Matrix44 *a)

{
  int iVar1;
  Element_Type *pEVar2;
  undefined4 local_1c;
  int r;
  Matrix44 *a_local;
  Matrix44 *this_local;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    pEVar2 = at(a,local_1c,0);
    iVar1 = *pEVar2;
    pEVar2 = at(this,local_1c,0);
    *pEVar2 = *pEVar2 - iVar1;
    pEVar2 = at(a,local_1c,1);
    iVar1 = *pEVar2;
    pEVar2 = at(this,local_1c,1);
    *pEVar2 = *pEVar2 - iVar1;
    pEVar2 = at(a,local_1c,2);
    iVar1 = *pEVar2;
    pEVar2 = at(this,local_1c,2);
    *pEVar2 = *pEVar2 - iVar1;
    pEVar2 = at(a,local_1c,3);
    iVar1 = *pEVar2;
    pEVar2 = at(this,local_1c,3);
    *pEVar2 = *pEVar2 - iVar1;
  }
  return this;
}

Assistant:

inline Matrix44& operator -= (const Matrix44& a)
    {
      for (int r = 0; r < NUM_ROWS; r++)
      {
        at(r, 0) -= a.at(r, 0);
        at(r, 1) -= a.at(r, 1);
        at(r, 2) -= a.at(r, 2);
        at(r, 3) -= a.at(r, 3);
      }
      return *this;
    }